

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger closure_getinfos(HSQUIRRELVM v)

{
  undefined8 uVar1;
  SQClosure *pSVar2;
  SQFunctionProto *pSVar3;
  SQSharedState *ss;
  ulong uVar4;
  ulong nidx;
  SQObjectPtr *pSVar5;
  SQTable *this;
  long nInitialSize;
  SQArray *pSVar6;
  SQString *pSVar7;
  SQUnsignedInteger SVar8;
  longlong *plVar9;
  SQObjectPtr local_1a8;
  SQObjectPtr local_198;
  SQObjectPtr local_188;
  ulong local_178;
  SQUnsignedInteger n_1;
  SQObjectPtr typecheck;
  SQObjectPtr local_150;
  SQObjectPtr local_140;
  SQObjectPtr local_130;
  SQObjectPtr local_120;
  SQClosure *local_110;
  SQNativeClosure *nc;
  SQObjectPtr local_f8;
  SQObjectPtr local_e8;
  SQObjectPtr local_d8;
  SQObjectPtr local_c8;
  SQObjectPtr local_b8;
  SQObjectPtr local_a8;
  SQObjectPtr local_98;
  SQObjectPtr local_88;
  long local_78;
  SQInteger j;
  SQInteger n;
  undefined1 local_58 [8];
  SQObjectPtr defparams;
  SQObjectPtr params;
  SQInteger nparams;
  SQFunctionProto *f;
  SQTable *res;
  SQObject o;
  HSQUIRRELVM v_local;
  
  pSVar5 = stack_get(v,1);
  uVar1 = *(undefined8 *)&pSVar5->super_SQObject;
  pSVar2 = (pSVar5->super_SQObject)._unVal.pClosure;
  this = SQTable::Create(v->_sharedstate,4);
  res._0_4_ = (int)uVar1;
  if ((int)res == 0x8000100) {
    pSVar3 = pSVar2->_function;
    nInitialSize = (pSVar3->_nparameters + 1) - (ulong)(pSVar3->_varparams == 0);
    pSVar6 = SQArray::Create(v->_sharedstate,nInitialSize);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&defparams.super_SQObject._unVal,pSVar6);
    pSVar6 = SQArray::Create(v->_sharedstate,pSVar3->_ndefaultparams);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_58,pSVar6);
    for (j = 0; j < pSVar3->_nparameters; j = j + 1) {
      SQArray::Set((SQArray *)params.super_SQObject._0_8_,j,pSVar3->_parameters + j);
    }
    for (local_78 = 0; local_78 < pSVar3->_ndefaultparams; local_78 = local_78 + 1) {
      SQArray::Set((SQArray *)defparams.super_SQObject._0_8_,local_78,
                   pSVar2->_defaultparams + local_78);
    }
    if (pSVar3->_varparams != 0) {
      pSVar7 = SQString::Create(v->_sharedstate,"...",-1);
      SQObjectPtr::SQObjectPtr(&local_88,pSVar7);
      SQArray::Set((SQArray *)params.super_SQObject._0_8_,nInitialSize + -1,&local_88);
      SQObjectPtr::~SQObjectPtr(&local_88);
    }
    pSVar7 = SQString::Create(v->_sharedstate,"native",-1);
    SQObjectPtr::SQObjectPtr(&local_98,pSVar7);
    SQObjectPtr::SQObjectPtr(&local_a8,false);
    SQTable::NewSlot(this,&local_98,&local_a8);
    SQObjectPtr::~SQObjectPtr(&local_a8);
    SQObjectPtr::~SQObjectPtr(&local_98);
    pSVar7 = SQString::Create(v->_sharedstate,"name",-1);
    SQObjectPtr::SQObjectPtr(&local_b8,pSVar7);
    SQTable::NewSlot(this,&local_b8,&pSVar3->_name);
    SQObjectPtr::~SQObjectPtr(&local_b8);
    pSVar7 = SQString::Create(v->_sharedstate,"src",-1);
    SQObjectPtr::SQObjectPtr(&local_c8,pSVar7);
    SQTable::NewSlot(this,&local_c8,&pSVar3->_sourcename);
    SQObjectPtr::~SQObjectPtr(&local_c8);
    pSVar7 = SQString::Create(v->_sharedstate,"parameters",-1);
    SQObjectPtr::SQObjectPtr(&local_d8,pSVar7);
    SQTable::NewSlot(this,&local_d8,(SQObjectPtr *)&defparams.super_SQObject._unVal);
    SQObjectPtr::~SQObjectPtr(&local_d8);
    pSVar7 = SQString::Create(v->_sharedstate,"varargs",-1);
    SQObjectPtr::SQObjectPtr(&local_e8,pSVar7);
    SQObjectPtr::SQObjectPtr(&local_f8,pSVar3->_varparams);
    SQTable::NewSlot(this,&local_e8,&local_f8);
    SQObjectPtr::~SQObjectPtr(&local_f8);
    SQObjectPtr::~SQObjectPtr(&local_e8);
    pSVar7 = SQString::Create(v->_sharedstate,"defparams",-1);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&nc,pSVar7);
    SQTable::NewSlot(this,(SQObjectPtr *)&nc,(SQObjectPtr *)local_58);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&nc);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_58);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&defparams.super_SQObject._unVal);
  }
  else {
    local_110 = pSVar2;
    pSVar7 = SQString::Create(v->_sharedstate,"native",-1);
    SQObjectPtr::SQObjectPtr(&local_120,pSVar7);
    SQObjectPtr::SQObjectPtr(&local_130,true);
    SQTable::NewSlot(this,&local_120,&local_130);
    SQObjectPtr::~SQObjectPtr(&local_130);
    SQObjectPtr::~SQObjectPtr(&local_120);
    pSVar7 = SQString::Create(v->_sharedstate,"name",-1);
    SQObjectPtr::SQObjectPtr(&local_140,pSVar7);
    SQTable::NewSlot(this,&local_140,
                     (SQObjectPtr *)&local_110[1].super_SQCollectable.super_SQRefCounted._weakref);
    SQObjectPtr::~SQObjectPtr(&local_140);
    pSVar7 = SQString::Create(v->_sharedstate,"paramscheck",-1);
    SQObjectPtr::SQObjectPtr(&local_150,pSVar7);
    SQObjectPtr::SQObjectPtr
              ((SQObjectPtr *)&typecheck.super_SQObject._unVal,(SQInteger)local_110->_env);
    SQTable::NewSlot(this,&local_150,(SQObjectPtr *)&typecheck.super_SQObject._unVal);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&typecheck.super_SQObject._unVal);
    SQObjectPtr::~SQObjectPtr(&local_150);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&n_1);
    SVar8 = sqvector<long_long>::size((sqvector<long_long> *)&local_110->_root);
    if (SVar8 != 0) {
      ss = v->_sharedstate;
      SVar8 = sqvector<long_long>::size((sqvector<long_long> *)&local_110->_root);
      pSVar6 = SQArray::Create(ss,SVar8);
      SQObjectPtr::operator=((SQObjectPtr *)&n_1,pSVar6);
      for (local_178 = 0; uVar4 = local_178,
          SVar8 = sqvector<long_long>::size((sqvector<long_long> *)&local_110->_root),
          uVar1 = typecheck.super_SQObject._0_8_, nidx = local_178, uVar4 < SVar8;
          local_178 = local_178 + 1) {
        plVar9 = sqvector<long_long>::operator[]((sqvector<long_long> *)&local_110->_root,local_178)
        ;
        SQObjectPtr::SQObjectPtr(&local_188,*plVar9);
        SQArray::Set((SQArray *)uVar1,nidx,&local_188);
        SQObjectPtr::~SQObjectPtr(&local_188);
      }
    }
    pSVar7 = SQString::Create(v->_sharedstate,"typecheck",-1);
    SQObjectPtr::SQObjectPtr(&local_198,pSVar7);
    SQTable::NewSlot(this,&local_198,(SQObjectPtr *)&n_1);
    SQObjectPtr::~SQObjectPtr(&local_198);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&n_1);
  }
  SQObjectPtr::SQObjectPtr(&local_1a8,this);
  SQVM::Push(v,&local_1a8);
  SQObjectPtr::~SQObjectPtr(&local_1a8);
  return 1;
}

Assistant:

static SQInteger closure_getinfos(HSQUIRRELVM v) {
    SQObject o = stack_get(v,1);
    SQTable *res = SQTable::Create(_ss(v),4);
    if(type(o) == OT_CLOSURE) {
        SQFunctionProto *f = _closure(o)->_function;
        SQInteger nparams = f->_nparameters + (f->_varparams?1:0);
        SQObjectPtr params = SQArray::Create(_ss(v),nparams);
    SQObjectPtr defparams = SQArray::Create(_ss(v),f->_ndefaultparams);
        for(SQInteger n = 0; n<f->_nparameters; n++) {
            _array(params)->Set((SQInteger)n,f->_parameters[n]);
        }
    for(SQInteger j = 0; j<f->_ndefaultparams; j++) {
            _array(defparams)->Set((SQInteger)j,_closure(o)->_defaultparams[j]);
        }
        if(f->_varparams) {
            _array(params)->Set(nparams-1,SQString::Create(_ss(v),_SC("..."),-1));
        }
        res->NewSlot(SQString::Create(_ss(v),_SC("native"),-1),false);
        res->NewSlot(SQString::Create(_ss(v),_SC("name"),-1),f->_name);
        res->NewSlot(SQString::Create(_ss(v),_SC("src"),-1),f->_sourcename);
        res->NewSlot(SQString::Create(_ss(v),_SC("parameters"),-1),params);
        res->NewSlot(SQString::Create(_ss(v),_SC("varargs"),-1),f->_varparams);
    res->NewSlot(SQString::Create(_ss(v),_SC("defparams"),-1),defparams);
    }
    else { //OT_NATIVECLOSURE
        SQNativeClosure *nc = _nativeclosure(o);
        res->NewSlot(SQString::Create(_ss(v),_SC("native"),-1),true);
        res->NewSlot(SQString::Create(_ss(v),_SC("name"),-1),nc->_name);
        res->NewSlot(SQString::Create(_ss(v),_SC("paramscheck"),-1),nc->_nparamscheck);
        SQObjectPtr typecheck;
        if(nc->_typecheck.size() > 0) {
            typecheck =
                SQArray::Create(_ss(v), nc->_typecheck.size());
            for(SQUnsignedInteger n = 0; n<nc->_typecheck.size(); n++) {
                    _array(typecheck)->Set((SQInteger)n,nc->_typecheck[n]);
            }
        }
        res->NewSlot(SQString::Create(_ss(v),_SC("typecheck"),-1),typecheck);
    }
    v->Push(res);
    return 1;
}